

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::~Discreet3DSImporter(Discreet3DSImporter *this)

{
  ~Discreet3DSImporter(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

Discreet3DSImporter::~Discreet3DSImporter() {
    // empty
}